

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<Object_Nested_Test<wchar_t>_>::CreateTest
          (TestFactoryImpl<Object_Nested_Test<wchar_t>_> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x188);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__Object_001f2a98;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)(this_00 + 1));
  this_00->_vptr_Test = (_func_int **)&PTR__Object_001f36e0;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }